

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEXE.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *this;
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *aarg;
  pointer pbVar2;
  allocator local_465;
  int value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  App app;
  
  value = 0;
  std::__cxx11::string::string((string *)&local_3a8,"Test App",(allocator *)&local_460);
  std::__cxx11::string::string((string *)&local_3c8,"",&local_465);
  CLI::App::App(&app,&local_3a8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::string((string *)&local_3e8,"-v",(allocator *)&local_460);
  std::__cxx11::string::string((string *)&local_408,"value",&local_465);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>(&app,&local_3e8,&value,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::string((string *)&local_428,"sub",(allocator *)&local_460);
  std::__cxx11::string::string((string *)&local_448,"",&local_465);
  this = CLI::App::add_subcommand(&app,&local_428,&local_448);
  this->prefix_command_ = true;
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  poVar1 = std::operator<<((ostream *)&std::cout,"value =");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,value);
  std::operator<<(poVar1,'\n');
  std::operator<<((ostream *)&std::cout,"after Args:");
  CLI::App::remaining_abi_cxx11_(&local_460,this,false);
  for (pbVar2 = local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_460.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)pbVar2);
    std::operator<<(poVar1," ");
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_460);
  std::operator<<((ostream *)&std::cout,'\n');
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {

    int value{0};
    CLI::App app{"Test App"};
    app.add_option("-v", value, "value");

    auto *subcom = app.add_subcommand("sub", "")->prefix_command();
    CLI11_PARSE(app, argc, argv);

    std::cout << "value =" << value << '\n';
    std::cout << "after Args:";
    for(const auto &aarg : subcom->remaining()) {
        std::cout << aarg << " ";
    }
    std::cout << '\n';
}